

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O0

optional<jbcoin::STObject> *
jbcoin::STParsedJSONDetail::parseObject
          (optional<jbcoin::STObject> *__return_storage_ptr__,string *json_name,Value *json,
          SField *inName,int depth,Value *error)

{
  SerializedTypeID SVar1;
  bool bVar2;
  ResultOfSetTypeFromSField RVar3;
  reference_type args;
  reference_type pSVar4;
  Value local_330;
  undefined1 local_318 [8];
  optional<jbcoin::detail::STVar> leaf;
  exception *anon_var_0_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  optional<jbcoin::detail::STVar> array;
  exception *anon_var_0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  optional<jbcoin::STObject> ret;
  Value local_120;
  Value local_108;
  SField *local_f8;
  SField *field;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fieldName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  iterator __end2;
  iterator __begin2;
  Members local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  Members *__range2;
  STObject data;
  Value local_60;
  Value local_48;
  Value *local_38;
  Value *error_local;
  SField *pSStack_28;
  int depth_local;
  SField *inName_local;
  Value *json_local;
  string *json_name_local;
  
  local_38 = error;
  error_local._4_4_ = depth;
  pSStack_28 = inName;
  inName_local = (SField *)json;
  json_local = (Value *)json_name;
  json_name_local = (string *)__return_storage_ptr__;
  bVar2 = Json::Value::isObject(json);
  if (bVar2) {
    if (error_local._4_4_ < 0x41) {
      STObject::STObject((STObject *)&__range2,pSStack_28);
      Json::Value::getMemberNames_abi_cxx11_(&local_b8,(Value *)inName_local);
      local_a0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_b8;
      __end2._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           beast::unit_test::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_a0);
      local_d8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           beast::unit_test::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_a0);
      while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_d8), bVar2) {
        value = (Value *)__gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&__end2);
        field = (SField *)Json::Value::operator[]((Value *)inName_local,(string *)value);
        local_f8 = SField::getField((string *)value);
        bVar2 = SField::operator==(local_f8,(SField *)sfInvalid);
        if (bVar2) {
          unknown_field((STParsedJSONDetail *)&local_108,(string *)json_local,(string *)value);
          Json::Value::operator=(local_38,&local_108);
          Json::Value::~Value(&local_108);
          boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
          fieldName._4_4_ = 1;
          goto LAB_002ffcf2;
        }
        SVar1 = local_f8->fieldType;
        if (SVar1 == STI_OBJECT) {
LAB_002ff78d:
          bVar2 = Json::Value::isObject((Value *)field);
          if (!bVar2) {
            not_an_object((STParsedJSONDetail *)&local_120,(string *)json_local,(string *)value);
            Json::Value::operator=(local_38,&local_120);
            Json::Value::~Value(&local_120);
            boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
            fieldName._4_4_ = 1;
            goto LAB_002ffcf2;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a0,(char *)json_local);
          std::operator+(&local_180,&local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value)
          ;
          parseObject((optional<jbcoin::STObject> *)local_160,&local_180,(Value *)field,local_f8,
                      error_local._4_4_ + 1,local_38);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          bVar2 = boost::optional<jbcoin::STObject>::operator!
                            ((optional<jbcoin::STObject> *)local_160);
          if (bVar2) {
            boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
          }
          else {
            args = boost::optional<jbcoin::STObject>::operator*
                             ((optional<jbcoin::STObject> *)local_160);
            STObject::emplace_back<jbcoin::STObject>((STObject *)&__range2,args);
          }
          fieldName._4_4_ = (uint)bVar2;
          boost::optional<jbcoin::STObject>::~optional((optional<jbcoin::STObject> *)local_160);
        }
        else if (SVar1 == STI_ARRAY) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_278,(char *)json_local);
          std::operator+(&local_258,&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value)
          ;
          parseArray((optional<jbcoin::detail::STVar> *)local_238,&local_258,(Value *)field,local_f8
                     ,error_local._4_4_ + 1,local_38);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
          bVar2 = boost::operator==(local_238);
          if (bVar2) {
            boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
          }
          else {
            pSVar4 = boost::optional<jbcoin::detail::STVar>::operator*
                               ((optional<jbcoin::detail::STVar> *)local_238);
            STObject::emplace_back<jbcoin::detail::STVar>((STObject *)&__range2,pSVar4);
          }
          fieldName._4_4_ = (uint)bVar2;
          boost::optional<jbcoin::detail::STVar>::~optional
                    ((optional<jbcoin::detail::STVar> *)local_238);
        }
        else {
          if ((uint)(SVar1 + 0xffffd8ef) < 3) goto LAB_002ff78d;
          parseLeaf((optional<jbcoin::detail::STVar> *)local_318,(string *)json_local,
                    (string *)value,pSStack_28,(Value *)field,local_38);
          bVar2 = boost::optional<jbcoin::detail::STVar>::operator!
                            ((optional<jbcoin::detail::STVar> *)local_318);
          if (bVar2) {
            boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
          }
          else {
            pSVar4 = boost::optional<jbcoin::detail::STVar>::operator*
                               ((optional<jbcoin::detail::STVar> *)local_318);
            STObject::emplace_back<jbcoin::detail::STVar>((STObject *)&__range2,pSVar4);
          }
          fieldName._4_4_ = (uint)bVar2;
          boost::optional<jbcoin::detail::STVar>::~optional
                    ((optional<jbcoin::detail::STVar> *)local_318);
        }
        if (fieldName._4_4_ != 0) goto LAB_002ffcf2;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      fieldName._4_4_ = 2;
LAB_002ffcf2:
      beast::unit_test::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
      if (fieldName._4_4_ == 2) {
        RVar3 = STObject::setTypeFromSField((STObject *)&__range2,pSStack_28);
        if (RVar3 == typeSetFail) {
          template_mismatch((STParsedJSONDetail *)&local_330,pSStack_28);
          Json::Value::operator=(local_38,&local_330);
          Json::Value::~Value(&local_330);
          boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
          fieldName._4_4_ = 1;
        }
        else {
          boost::optional<jbcoin::STObject>::optional
                    (__return_storage_ptr__,(rval_reference_type)&__range2);
          fieldName._4_4_ = 1;
        }
      }
      STObject::~STObject((STObject *)&__range2);
    }
    else {
      too_deep((STParsedJSONDetail *)&local_60,(string *)json_local);
      Json::Value::operator=(local_38,&local_60);
      Json::Value::~Value(&local_60);
      boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
    }
  }
  else {
    not_an_object((STParsedJSONDetail *)&local_48,(string *)json_local);
    Json::Value::operator=(local_38,&local_48);
    Json::Value::~Value(&local_48);
    boost::optional<jbcoin::STObject>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static boost::optional <STObject> parseObject (
    std::string const& json_name,
    Json::Value const& json,
    SField const& inName,
    int depth,
    Json::Value& error)
{
    if (! json.isObject ())
    {
        error = not_an_object (json_name);
        return boost::none;
    }

    if (depth > maxDepth)
    {
        error = too_deep (json_name);
        return boost::none;
    }

    STObject data (inName);

    for (auto const& fieldName : json.getMemberNames ())
    {
        Json::Value const& value = json [fieldName];

        auto const& field = SField::getField (fieldName);

        if (field == sfInvalid)
        {
            error = unknown_field (json_name, fieldName);
            return boost::none;
        }

        switch (field.fieldType)
        {

        // Object-style containers (which recurse).
        case STI_OBJECT:
        case STI_TRANSACTION:
        case STI_LEDGERENTRY:
        case STI_VALIDATION:
            if (! value.isObject ())
            {
                error = not_an_object (json_name, fieldName);
                return boost::none;
            }

            try
            {
                auto ret = parseObject (json_name + "." + fieldName,
                    value, field, depth + 1, error);
                if (! ret)
                    return boost::none;
                data.emplace_back (std::move (*ret));
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return boost::none;
            }

            break;

        // Array-style containers (which recurse).
        case STI_ARRAY:
            try
            {
                auto array = parseArray (json_name + "." + fieldName,
                    value, field, depth + 1, error);
                if (array == boost::none)
                    return boost::none;
                data.emplace_back (std::move (*array));
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return boost::none;
            }

            break;

        // Everything else (types that don't recurse).
        default:
            {
                auto leaf =
                    parseLeaf (json_name, fieldName, &inName, value, error);

                if (!leaf)
                    return boost::none;

                data.emplace_back (std::move (*leaf));
            }

            break;
        }
    }

    // Some inner object types have templates.  Attempt to apply that.
    if (data.setTypeFromSField (inName) == STObject::typeSetFail)
    {
        error = template_mismatch (inName);
        return boost::none;
    }

    return std::move (data);
}